

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientUtils.cpp
# Opt level: O1

string * ClientUtils::AdaptDeviceName
                   (string *__return_storage_ptr__,string *i_rDeviceName,uint i_DeviceID)

{
  size_type sVar1;
  pointer pcVar2;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  uint local_10c;
  undefined1 local_108 [224];
  put_holder<char,_std::char_traits<char>_> local_28;
  
  sVar1 = i_rDeviceName->_M_string_length;
  local_10c = i_DeviceID;
  if (sVar1 == 0) {
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
              ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
               "Unnamed Device %d");
    local_28.arg = &local_10c;
    local_28.put_head =
         boost::io::detail::call_put_head<char,std::char_traits<char>,unsigned_int_const>;
    local_28.put_last =
         boost::io::detail::call_put_last<char,std::char_traits<char>,unsigned_int_const>;
    this = boost::io::detail::
           feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                     ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108
                      ,&local_28);
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
              (__return_storage_ptr__,this);
    if (local_108[0xd0] == true) {
      std::locale::~locale((locale *)(local_108 + 0xd8));
      local_108[0xd0] = false;
    }
    boost::io::basic_altstringbuf<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_altstringbuf((basic_altstringbuf<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_108 + 0x78));
    if ((undefined1 *)local_108._80_8_ != local_108 + 0x60) {
      operator_delete((void *)local_108._80_8_);
    }
    if ((_Bit_type *)local_108._24_8_ != (_Bit_type *)0x0) {
      operator_delete((void *)local_108._24_8_);
      local_108._24_8_ = (_Bit_type *)0x0;
      local_108._32_4_ = 0;
      local_108._40_8_ = (_Bit_type *)0x0;
      local_108._48_4_ = 0;
      local_108._56_8_ = (_Bit_pointer)0x0;
    }
    std::
    vector<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_108);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (i_rDeviceName->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + sVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AdaptDeviceName( const std::string & i_rDeviceName, 
                               const unsigned int  i_DeviceID )
  {
    if( !i_rDeviceName.empty() )
    {
      return i_rDeviceName;
    }
    else
    {
      return str( boost::format( "Unnamed Device %d" ) % i_DeviceID );
    }
  }